

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O2

bool anon_unknown.dwarf_62df::OutputCues
               (Segment *segment,Tracks *tracks,Options *options,FILE *o,Indent *indent)

{
  string *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  Cues *this;
  unsigned_long uVar5;
  Track *pTrack;
  TrackPosition *pTVar6;
  long lVar7;
  ulong uVar8;
  longlong lVar9;
  Cues *extraout_RAX;
  unsigned_long uVar10;
  uint local_9c;
  CuePoint *local_98;
  undefined8 local_50 [4];
  
  this = mkvparser::Segment::GetCues(segment);
  if (this != (Cues *)0x0) {
    while (bVar4 = mkvparser::Cues::DoneParsing(this), !bVar4) {
      mkvparser::Cues::LoadCuePoint(this);
    }
    local_98 = mkvparser::Cues::GetFirst(this);
    psVar1 = &indent->indent_str_;
    if (local_98 == (CuePoint *)0x0) {
      std::__cxx11::string::string((string *)local_50,(string *)psVar1);
      fprintf((FILE *)o,"%sNo cue points.\n",local_50[0]);
      this = (Cues *)std::__cxx11::string::~string((string *)local_50);
    }
    else {
      std::__cxx11::string::string((string *)local_50,(string *)psVar1);
      fprintf((FILE *)o,"%sCues:",local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      if (options->output_offset == true) {
        fprintf((FILE *)o," @:%lld",this->m_element_start);
      }
      if (options->output_size == true) {
        fprintf((FILE *)o," size:%lld",this->m_element_size);
      }
      fputc(10,(FILE *)o);
      uVar5 = mkvparser::Tracks::GetTracksCount(tracks);
      libwebm::Indent::Adjust(indent,2);
      uVar10 = uVar5 & 0xffffffff;
      if ((int)uVar5 < 1) {
        uVar10 = 0;
      }
      local_9c = 1;
      do {
        for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
          pTrack = mkvparser::Tracks::GetTrackByIndex(tracks,uVar5);
          pTVar6 = mkvparser::CuePoint::Find(local_98,pTrack);
          if (pTVar6 != (TrackPosition *)0x0) {
            lVar7 = mkvparser::Track::GetType(pTrack);
            std::__cxx11::string::string((string *)local_50,(string *)psVar1);
            uVar3 = local_50[0];
            uVar8 = mkvparser::Track::GetNumber(pTrack);
            uVar2 = 0x41;
            if (lVar7 == 1) {
              uVar2 = 0x56;
            }
            fprintf((FILE *)o,"%sCue Point:%d type:%c track:%d",uVar3,(ulong)local_9c,uVar2,
                    uVar8 & 0xffffffff);
            std::__cxx11::string::~string((string *)local_50);
            bVar4 = options->output_seconds;
            lVar9 = mkvparser::CuePoint::GetTime(local_98,segment);
            if (bVar4 == true) {
              fprintf((FILE *)o," secs:%g",(double)lVar9 / 1000000000.0);
            }
            else {
              fprintf((FILE *)o," nano:%lld",lVar9);
            }
            if (options->output_blocks == true) {
              fprintf((FILE *)o," block:%lld",pTVar6->m_block);
            }
            if (options->output_offset == true) {
              fprintf((FILE *)o," @:%lld",pTVar6->m_pos);
            }
            fputc(10,(FILE *)o);
          }
        }
        local_98 = mkvparser::Cues::GetNext(this,local_98);
        local_9c = local_9c + 1;
      } while (local_98 != (CuePoint *)0x0);
      libwebm::Indent::Adjust(indent,-2);
      this = extraout_RAX;
    }
  }
  return SUB81(this,0);
}

Assistant:

bool OutputCues(const mkvparser::Segment& segment,
                const mkvparser::Tracks& tracks, const Options& options,
                FILE* o, Indent* indent) {
  const mkvparser::Cues* const cues = segment.GetCues();
  if (cues == NULL)
    return true;

  // Load all of the cue points.
  while (!cues->DoneParsing())
    cues->LoadCuePoint();

  // Confirm that the input has cue points.
  const mkvparser::CuePoint* const first_cue = cues->GetFirst();
  if (first_cue == NULL) {
    fprintf(o, "%sNo cue points.\n", indent->indent_str().c_str());
    return true;
  }

  // Input has cue points, dump them:
  fprintf(o, "%sCues:", indent->indent_str().c_str());
  if (options.output_offset)
    fprintf(o, " @:%lld", cues->m_element_start);
  if (options.output_size)
    fprintf(o, " size:%lld", cues->m_element_size);
  fprintf(o, "\n");

  const mkvparser::CuePoint* cue_point = first_cue;
  int cue_point_num = 1;
  const int num_tracks = static_cast<int>(tracks.GetTracksCount());
  indent->Adjust(libwebm::kIncreaseIndent);

  do {
    for (int track_num = 0; track_num < num_tracks; ++track_num) {
      const mkvparser::Track* const track = tracks.GetTrackByIndex(track_num);
      const mkvparser::CuePoint::TrackPosition* const track_pos =
          cue_point->Find(track);

      if (track_pos != NULL) {
        const char track_type =
            (track->GetType() == mkvparser::Track::kVideo) ? 'V' : 'A';
        fprintf(o, "%sCue Point:%d type:%c track:%d",
                indent->indent_str().c_str(), cue_point_num, track_type,
                static_cast<int>(track->GetNumber()));

        if (options.output_seconds) {
          fprintf(o, " secs:%g",
                  cue_point->GetTime(&segment) / kNanosecondsPerSecond);
        } else {
          fprintf(o, " nano:%lld", cue_point->GetTime(&segment));
        }

        if (options.output_blocks)
          fprintf(o, " block:%lld", track_pos->m_block);

        if (options.output_offset)
          fprintf(o, " @:%lld", track_pos->m_pos);

        fprintf(o, "\n");
      }
    }

    cue_point = cues->GetNext(cue_point);
    ++cue_point_num;
  } while (cue_point != NULL);

  indent->Adjust(libwebm::kDecreaseIndent);
  return true;
}